

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_detection.cpp
# Opt level: O0

float __thiscall ncnn::ObjectBox::box_intersection(ObjectBox *this,ObjectBox *other)

{
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float area;
  float intersection_h;
  float intersection_w;
  float local_4;
  
  local_4 = box_overlap(*in_RDI,in_RDI[2],*in_RSI,in_RSI[2]);
  fVar1 = box_overlap(in_RDI[1],in_RDI[3],in_RSI[1],in_RSI[3]);
  if ((local_4 < 0.0) || (fVar1 < 0.0)) {
    local_4 = 0.0;
  }
  else {
    local_4 = local_4 * fVar1;
  }
  return local_4;
}

Assistant:

float ObjectBox::box_intersection(const ObjectBox &other) const
{
    float intersection_w = box_overlap(xmin, xmax, other.xmin, other.xmax);
    float intersection_h = box_overlap(ymin, ymax, other.ymin, other.ymax);
    if (intersection_w < 0 || intersection_h < 0)
        return 0;
    float area = intersection_w * intersection_h;
    return area;
}